

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O0

int mdns_socket_setup_ipv4(int sock)

{
  int iVar1;
  uint32_t local_30 [2];
  ip_mreq req;
  undefined1 local_20 [2];
  uchar loopback;
  uchar ttl;
  int flags;
  sockaddr_in saddr;
  int sock_local;
  
  saddr.sin_zero._0_4_ = sock;
  memset(local_20,0,0x10);
  local_20 = (undefined1  [2])0x2;
  flags = 0;
  iVar1 = bind(saddr.sin_zero._0_4_,(sockaddr *)local_20,0x10);
  if (iVar1 == 0) {
    req.imr_interface.s_addr = fcntl(saddr.sin_zero._0_4_,3,0);
    fcntl(saddr.sin_zero._0_4_,4,(ulong)(req.imr_interface.s_addr | 0x800));
    req.imr_multiaddr.s_addr._3_1_ = 1;
    req.imr_multiaddr.s_addr._2_1_ = 1;
    setsockopt(saddr.sin_zero._0_4_,0,0x21,(void *)((long)&req.imr_multiaddr.s_addr + 3),1);
    setsockopt(saddr.sin_zero._0_4_,0,0x22,(void *)((long)&req.imr_multiaddr.s_addr + 2),1);
    memset(local_30,0,8);
    local_30[0] = htonl(0xe00000fb);
    local_30[1] = 0;
    iVar1 = setsockopt(saddr.sin_zero._0_4_,0,0x23,local_30,8);
    if (iVar1 == 0) {
      saddr.sin_zero[4] = '\0';
      saddr.sin_zero[5] = '\0';
      saddr.sin_zero[6] = '\0';
      saddr.sin_zero[7] = '\0';
    }
    else {
      saddr.sin_zero[4] = 0xff;
      saddr.sin_zero[5] = 0xff;
      saddr.sin_zero[6] = 0xff;
      saddr.sin_zero[7] = 0xff;
    }
  }
  else {
    saddr.sin_zero[4] = 0xff;
    saddr.sin_zero[5] = 0xff;
    saddr.sin_zero[6] = 0xff;
    saddr.sin_zero[7] = 0xff;
  }
  iVar1._0_1_ = saddr.sin_zero[4];
  iVar1._1_1_ = saddr.sin_zero[5];
  iVar1._2_1_ = saddr.sin_zero[6];
  iVar1._3_1_ = saddr.sin_zero[7];
  return iVar1;
}

Assistant:

int
mdns_socket_setup_ipv4(int sock) {
	struct sockaddr_in saddr;
	memset(&saddr, 0, sizeof(saddr));
	saddr.sin_family = AF_INET;
	saddr.sin_addr.s_addr = INADDR_ANY;
#ifdef __APPLE__
	saddr.sin_len = sizeof(saddr);
#endif

	if (bind(sock, (struct sockaddr*)&saddr, sizeof(saddr)))
		return -1;

#ifdef _WIN32
	unsigned long param = 1;
	ioctlsocket(sock, FIONBIO, &param);
#else
	const int flags = fcntl(sock, F_GETFL, 0);
	fcntl(sock, F_SETFL, flags | O_NONBLOCK);
#endif

	unsigned char ttl = 1;
	unsigned char loopback = 1;
	struct ip_mreq req;

	setsockopt(sock, IPPROTO_IP, IP_MULTICAST_TTL, (const char*)&ttl, sizeof(ttl));
	setsockopt(sock, IPPROTO_IP, IP_MULTICAST_LOOP, (const char*)&loopback, sizeof(loopback));

	memset(&req, 0, sizeof(req));
	req.imr_multiaddr.s_addr = htonl((((uint32_t)224U) << 24U) | ((uint32_t)251U));
	req.imr_interface.s_addr = INADDR_ANY;
	if (setsockopt(sock, IPPROTO_IP, IP_ADD_MEMBERSHIP, (char*)&req, sizeof(req)))
		return -1;

	return 0;
}